

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadIO(xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,char *URL,
                   char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_58;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  
  local_58 = (xmlDocPtr)0x0;
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    ioread_local = (xmlInputReadCallback)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt_00,options);
    input_00 = xmlCtxtNewInputFromIO(ctxt_00,URL,ioread,ioclose,ioctx,encoding,0);
    if (input_00 != (xmlParserInputPtr)0x0) {
      local_58 = xmlCtxtParseDocument(ctxt_00,input_00);
    }
    xmlFreeParserCtxt(ctxt_00);
    ioread_local = (xmlInputReadCallback)local_58;
  }
  return (xmlDocPtr)ioread_local;
}

Assistant:

xmlDocPtr
xmlReadIO(xmlInputReadCallback ioread, xmlInputCloseCallback ioclose,
          void *ioctx, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromIO(ctxt, URL, ioread, ioclose, ioctx,
                                  encoding, 0);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}